

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::GetFileNameBase_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  long lVar1;
  string base;
  string proto_file;
  string local_78;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  lVar1 = **(long **)this;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>((string *)local_38,lVar1,(*(long **)this)[1] + lVar1);
  std::__cxx11::string::find_last_of((char *)local_38,0x359ed6,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_58,(ulong)local_38);
  std::__cxx11::string::find_last_of((char *)local_58,0x35b5d3,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)local_58);
  UnderscoresToCamelCase(__return_storage_ptr__,&local_78,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileNameBase(const FileDescriptor* descriptor) {
    std::string proto_file = descriptor->name();
    int lastslash = proto_file.find_last_of("/");
    std::string base = proto_file.substr(lastslash + 1);
    return UnderscoresToPascalCase(StripDotProto(base));
}